

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

NonceT __thiscall
tonk::SessionOutgoing::writeNonce(SessionOutgoing *this,uint8_t *footer,uint *footerBytesOut)

{
  NonceT NVar1;
  int32_t mag;
  NonceT nonce;
  uint *footerBytesOut_local;
  uint8_t *footer_local;
  SessionOutgoing *this_local;
  
  NVar1 = this->NextNonce;
  this->NextNonce = NVar1 + 1;
  *footerBytesOut = 3;
  if ((this->ShouldCompressSequenceNumbers & 1U) != 0) {
    mag = (int)NVar1 - (int)(this->LastAck).PeerNextExpectedNonce.Value;
    if (mag == 1) {
      *footerBytesOut = 0;
    }
    else {
      if (mag < 0) {
        mag = -mag;
      }
      if (mag + 1 < 0x80) {
        *footerBytesOut = 1;
      }
      else if (mag + 1 < 0x8000) {
        *footerBytesOut = 2;
      }
    }
  }
  *(int *)footer = (int)NVar1;
  return NVar1;
}

Assistant:

NonceT SessionOutgoing::writeNonce(uint8_t* footer, unsigned& footerBytesOut)
{
    // Note nonce can roll over here back to 0, and that is okay because this
    // is not intended to provide real data security.
    NonceT nonce = NextNonce++;

    // Choose the number of bytes to send:
    footerBytesOut = 3;

#ifdef TONK_ENABLE_NONCE_COMPRESSION
    if (ShouldCompressSequenceNumbers)
    {
        // Use the magnitude of the difference between this nonce and the peer's
        // next expected nonce to decide how many bytes to send for the field.
        int32_t mag = (int32_t)nonce - (int32_t)LastAck.PeerNextExpectedNonce.ToUnsigned();

#if 1
        if (mag == 1) {
            footerBytesOut = 0;
        }
        else
#endif
        {
            if (mag < 0) {
                TONK_DEBUG_BREAK(); // Should never happen
                mag = -mag;
            }
            ++mag;
            TONK_DEBUG_ASSERT(mag < 0x800000);

            if (mag < 0x80) {
                footerBytesOut = 1;
            }
            else if (mag < 0x8000) {
                footerBytesOut = 2;
            }
        }
    }
#endif

    protocol::WriteFooterField(footer, (uint32_t)nonce, footerBytesOut);

    return nonce;
}